

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::unary_op_log<float>>(Mat *a,Option *opt)

{
  size_t sVar1;
  float *pfVar2;
  Mat *in_RDI;
  int i;
  int size;
  unary_op_log<float> op;
  float *in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  int iVar3;
  
  sVar1 = Mat::total(in_RDI);
  for (iVar3 = 0; iVar3 < (int)sVar1; iVar3 = iVar3 + 1) {
    Mat::operator[](in_RDI,(long)iVar3);
    in_stack_ffffffffffffffe0 =
         unary_op_log<float>::operator()
                   ((unary_op_log<float> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
    pfVar2 = Mat::operator[](in_RDI,(long)iVar3);
    *pfVar2 = in_stack_ffffffffffffffe0;
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int size = static_cast<int>(a.total());

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i=0; i<size; i++)
    {
        a[i] = op(a[i]);
    }

    return 0;
}